

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O0

int ecdsa_signature_to_asn1(mbedtls_mpi *r,mbedtls_mpi *s,uchar *sig,size_t *slen)

{
  long lVar1;
  long lVar2;
  long lVar3;
  size_t __n;
  size_t len;
  uchar *p;
  uchar buf [141];
  int ret;
  size_t *slen_local;
  uchar *sig_local;
  mbedtls_mpi *s_local;
  mbedtls_mpi *r_local;
  
  len = (size_t)(buf + 0x85);
  register0x00000000 = mbedtls_asn1_write_mpi((uchar **)&len,(uchar *)&p,s);
  r_local._4_4_ = register0x00000000;
  if (-1 < register0x00000000) {
    lVar1 = (long)register0x00000000;
    register0x00000000 = mbedtls_asn1_write_mpi((uchar **)&len,(uchar *)&p,r);
    r_local._4_4_ = register0x00000000;
    if (-1 < register0x00000000) {
      lVar2 = (long)register0x00000000;
      register0x00000000 = mbedtls_asn1_write_len((uchar **)&len,(uchar *)&p,lVar2 + lVar1);
      r_local._4_4_ = register0x00000000;
      if (-1 < register0x00000000) {
        lVar3 = (long)register0x00000000;
        register0x00000000 = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)&p,'0');
        r_local._4_4_ = register0x00000000;
        if (-1 < register0x00000000) {
          __n = (long)register0x00000000 + lVar3 + lVar2 + lVar1;
          memcpy(sig,(void *)len,__n);
          *slen = __n;
          r_local._4_4_ = 0;
        }
      }
    }
  }
  return r_local._4_4_;
}

Assistant:

static int ecdsa_signature_to_asn1( const mbedtls_mpi *r, const mbedtls_mpi *s,
                                    unsigned char *sig, size_t *slen )
{
    int ret;
    unsigned char buf[MBEDTLS_ECDSA_MAX_LEN];
    unsigned char *p = buf + sizeof( buf );
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &p, buf, s ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &p, buf, r ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &p, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &p, buf,
                                       MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) );

    memcpy( sig, p, len );
    *slen = len;

    return( 0 );
}